

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O0

bool __thiscall
binlog::SessionWriter::addEvent<signed_char&,signed_char_const&,signed_char_const&,signed_char>
          (SessionWriter *this,uint64_t eventSourceId,uint64_t clock,char *args,char *args_1,
          char *args_2,char *args_3)

{
  bool bVar1;
  size_t minQueueCapacity;
  size_t totalSize;
  size_t s;
  size_t *__end0;
  size_t *__begin0;
  size_t (*__range2) [6];
  size_t sizes [6];
  size_t size;
  QueueWriter *in_stack_fffffffffffffeb8;
  unsigned_long *in_stack_fffffffffffffec0;
  char *in;
  size_t in_stack_fffffffffffffed8;
  undefined4 *puVar2;
  QueueWriter *in_stack_fffffffffffffee0;
  QueueWriter *this_00;
  undefined1 local_b4 [28];
  long local_98;
  long *local_90;
  long *local_88;
  long *local_80;
  long local_78 [5];
  SessionWriter *in_stack_ffffffffffffffb8;
  long local_40;
  
  local_40 = 0;
  local_78[0] = 8;
  local_78[1] = 8;
  local_78[2] = mserialize::serialized_size<signed_char>((char *)0x11199a);
  local_78[3] = mserialize::serialized_size<signed_char>((char *)0x1119ce);
  local_78[4] = mserialize::serialized_size<signed_char>((char *)0x1119fc);
  minQueueCapacity = mserialize::serialized_size<signed_char>((char *)0x111a2a);
  local_90 = (long *)&stack0xffffffffffffffb8;
  local_80 = local_78;
  for (local_88 = local_80; local_88 != local_90; local_88 = local_88 + 1) {
    local_98 = *local_88;
    local_40 = local_98 + local_40;
  }
  local_b4._20_8_ = local_40 + 4;
  bVar1 = detail::QueueWriter::beginWrite(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (!bVar1) {
    replaceChannel(in_stack_ffffffffffffffb8,minQueueCapacity);
    bVar1 = detail::QueueWriter::beginWrite(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    if (!bVar1) {
      return false;
    }
  }
  mserialize::serialize<unsigned_int,binlog::detail::QueueWriter>
            ((uint *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  this_00 = (QueueWriter *)local_b4;
  mserialize::serialize<unsigned_long,binlog::detail::QueueWriter>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  *(undefined4 *)&this_00->_queue = 0;
  puVar2 = (undefined4 *)(local_b4 + 4);
  mserialize::serialize<signed_char,binlog::detail::QueueWriter>
            ((char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  *puVar2 = 0;
  mserialize::serialize<signed_char,binlog::detail::QueueWriter>
            ((char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_b4._8_4_ = 0;
  mserialize::serialize<signed_char,binlog::detail::QueueWriter>
            ((char *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_b4._12_4_ = 0;
  in = local_b4 + 0x10;
  mserialize::serialize<signed_char,binlog::detail::QueueWriter>(in,in_stack_fffffffffffffeb8);
  in[0] = '\0';
  in[1] = '\0';
  in[2] = '\0';
  in[3] = '\0';
  detail::QueueWriter::endWrite(this_00);
  return true;
}

Assistant:

bool SessionWriter::addEvent(std::uint64_t eventSourceId, std::uint64_t clock, Args&&... args) noexcept
{
  // compute size (excludes size field)
  std::size_t size = 0;
  const std::size_t sizes[] = {sizeof(eventSourceId), sizeof(clock), mserialize::serialized_size(args)...};
  for (auto s : sizes) { size += s; }

  // allocate space (totalSize includes size field)
  const std::size_t totalSize = size + sizeof(std::uint32_t);
  if (! _qw.beginWrite(totalSize))
  {
    // not enough space in queue, create a new channel
    replaceChannel(totalSize);
    if (! _qw.beginWrite(totalSize)) { return false; }
  }

  // serialize fields
  using swallow = int[];
  (void)swallow{
    (mserialize::serialize(std::uint32_t(size), _qw), int{}),
    (mserialize::serialize(eventSourceId, _qw), int{}),
    (mserialize::serialize(clock, _qw), int{}),
    (mserialize::serialize(args, _qw), int{})...
  };

  _qw.endWrite();
  return true;
}